

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RawSectorDump.hpp
# Opt level: O0

void __thiscall
Storage::MassStorage::RawSectorDump<512L>::RawSectorDump
          (RawSectorDump<512L> *this,string *file_name,long offset,long length)

{
  stat *psVar1;
  exception *this_00;
  __off_t local_60;
  long length_local;
  long offset_local;
  string *file_name_local;
  RawSectorDump<512L> *this_local;
  
  MassStorageDevice::MassStorageDevice(&this->super_MassStorageDevice);
  (this->super_MassStorageDevice)._vptr_MassStorageDevice =
       (_func_int **)&PTR__RawSectorDump_00caad80;
  FileHolder::FileHolder(&this->file_,file_name,ReadWrite);
  local_60 = length;
  if (length == -1) {
    psVar1 = FileHolder::stats(&this->file_);
    local_60 = psVar1->st_size;
  }
  this->file_size_ = local_60;
  this->file_start_ = offset;
  if (this->file_size_ % 0x200 == 0) {
    return;
  }
  this_00 = (exception *)__cxa_allocate_exception(8);
  std::exception::exception(this_00);
  __cxa_throw(this_00,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

RawSectorDump(const std::string &file_name, long offset = 0, long length = -1) :
			file_(file_name),
			file_size_((length == -1) ? long(file_.stats().st_size) : length),
			file_start_(offset)
		{
			// Is the file a multiple of sector_size bytes in size?
			if(file_size_ % sector_size) throw std::exception();
		}